

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_time.c
# Opt level: O1

stop_type_t parse_stop_type(char *value)

{
  int iVar1;
  stop_type_t sVar2;
  
  iVar1 = strcmp(value,"0");
  sVar2 = ST_REGULAR;
  if ((iVar1 != 0) && (*value != '\0')) {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      sVar2 = ST_NOT_AVAILABLE;
    }
    else {
      iVar1 = strcmp(value,"2");
      if (iVar1 == 0) {
        sVar2 = ST_CONTACT_AGENCY;
      }
      else {
        iVar1 = strcmp(value,"3");
        sVar2 = ST_NOT_SET - (iVar1 == 0);
      }
    }
  }
  return sVar2;
}

Assistant:

stop_type_t parse_stop_type(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return ST_REGULAR;
    else if (strcmp(value, "1") == 0)
        return ST_NOT_AVAILABLE;
    else if (strcmp(value, "2") == 0)
        return ST_CONTACT_AGENCY;
    else if (strcmp(value, "3") == 0)
        return ST_CONTACT_DRIVER;
    else
        return ST_NOT_SET;
}